

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O1

Token * __thiscall wabt::WastLexer::GetKeywordToken(Token *__return_storage_ptr__,WastLexer *this)

{
  TokenType token_type;
  Location loc;
  Location loc_00;
  TokenInfo *pTVar1;
  int iVar2;
  int iVar3;
  anon_class_8_1_8991fb9c column;
  undefined4 uStack_34;
  undefined4 uStack_14;
  
  ReadReservedChars(this);
  pTVar1 = anon_unknown_8::Perfect_Hash::InWordSet
                     (this->token_start_,(long)this->cursor_ - (long)this->token_start_);
  if (pTVar1 == (TokenInfo *)0x0) {
    TextToken(__return_storage_ptr__,this,Reserved,0);
  }
  else {
    token_type = pTVar1->token_type;
    if (token_type < First_Literal) {
      BareToken(__return_storage_ptr__,this,token_type);
    }
    else if ((token_type & ~AssertExhaustion) == First_Type) {
      iVar2 = (*(int *)&this->token_start_ - *(int *)&this->line_start_) + 1;
      if (iVar2 < 2) {
        iVar2 = 1;
      }
      iVar3 = (*(int *)&this->cursor_ - *(int *)&this->line_start_) + 1;
      if (iVar3 < 2) {
        iVar3 = 1;
      }
      loc.field_1.field_0.first_column = iVar2;
      loc.field_1.field_0.line = this->line_;
      loc.field_1._12_4_ = uStack_14;
      loc.field_1.field_0.last_column = iVar3;
      loc.filename._M_str = (this->filename_)._M_dataplus._M_p;
      loc.filename._M_len = (this->filename_)._M_string_length;
      Token::Token(__return_storage_ptr__,loc,pTVar1->token_type,(pTVar1->field_2).value_type);
    }
    else {
      if (0x41 < token_type - AtomicFence) {
        __assert_fail("IsTokenTypeOpcode(info->token_type)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-lexer.cc"
                      ,0x25a,"Token wabt::WastLexer::GetKeywordToken()");
      }
      iVar2 = (*(int *)&this->token_start_ - *(int *)&this->line_start_) + 1;
      if (iVar2 < 2) {
        iVar2 = 1;
      }
      iVar3 = (*(int *)&this->cursor_ - *(int *)&this->line_start_) + 1;
      if (iVar3 < 2) {
        iVar3 = 1;
      }
      loc_00.field_1.field_0.first_column = iVar2;
      loc_00.field_1.field_0.line = this->line_;
      loc_00.field_1._12_4_ = uStack_34;
      loc_00.field_1.field_0.last_column = iVar3;
      loc_00.filename._M_str = (this->filename_)._M_dataplus._M_p;
      loc_00.filename._M_len = (this->filename_)._M_string_length;
      Token::Token(__return_storage_ptr__,loc_00,pTVar1->token_type,
                   (Opcode)(pTVar1->field_2).opcode.enum_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetKeywordToken() {
  ReadReservedChars();
  TokenInfo* info =
      Perfect_Hash::InWordSet(token_start_, cursor_ - token_start_);
  if (!info) {
    return TextToken(TokenType::Reserved);
  }
  if (IsTokenTypeBare(info->token_type)) {
    return BareToken(info->token_type);
  } else if (IsTokenTypeType(info->token_type) ||
             IsTokenTypeRefKind(info->token_type)) {
    return Token(GetLocation(), info->token_type, info->value_type);
  } else {
    assert(IsTokenTypeOpcode(info->token_type));
    return Token(GetLocation(), info->token_type, info->opcode);
  }
}